

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

void fill_in_New_Menu(void)

{
  Fl_Menu_Item *mi;
  long *plVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  char *txt;
  Fl_Type *t;
  
  lVar5 = 0;
  do {
    plVar1 = *(long **)((long)&New_Menu[0].user_data_ + lVar5);
    if (plVar1 != (long *)0x0) {
      mi = (Fl_Menu_Item *)((long)&New_Menu[0].text + lVar5);
      if (mi->text == (char *)0x0) {
        pcVar3 = (char *)(**(code **)(*plVar1 + 0x28))(plVar1);
        if ((*pcVar3 == 'F') && (pcVar3[1] == 'l')) {
          lVar4 = (ulong)(pcVar3[2] == '_') * 3;
        }
        else {
          lVar4 = 0;
        }
        iVar2 = strncmp(pcVar3 + lVar4,"fltk::",6);
        txt = pcVar3 + lVar4 + 6;
        if (iVar2 != 0) {
          txt = pcVar3 + lVar4;
        }
        iVar2 = (**(code **)(*plVar1 + 0x140))(plVar1);
        make_iconlabel(mi,&pixmap[iVar2]->super_Fl_Image,txt);
      }
      else {
        iVar2 = (**(code **)(*plVar1 + 0x140))(plVar1);
        make_iconlabel(mi,&pixmap[iVar2]->super_Fl_Image,mi->text);
      }
    }
    lVar5 = lVar5 + 0x38;
  } while (lVar5 != 0xf18);
  return;
}

Assistant:

void fill_in_New_Menu() {
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (m->user_data()) {
      Fl_Type *t = (Fl_Type*)m->user_data();
      if (m->text) {
        make_iconlabel( m, pixmap[t->pixmapID()], m->label() );
      } else {
        const char *n = t->type_name();
        if (!strncmp(n,"Fl_",3)) n += 3;
        if (!strncmp(n,"fltk::",6)) n += 6;
        make_iconlabel( m, pixmap[t->pixmapID()], n );
      }
    }
  }
}